

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sitersol.c
# Opt level: O0

void spsolve(int n,float *x,float *y)

{
  float local_ac;
  float local_a8;
  float rcond;
  float rpg;
  int_t info;
  mem_usage_t *mem_usage;
  superlu_options_t *options;
  float *C;
  float *R;
  int *piStack_78;
  char equed [1];
  int *perm_r;
  int *perm_c;
  SuperLUStat_t *stat;
  SuperMatrix *U;
  SuperMatrix *L;
  SuperMatrix *A;
  float *y_local;
  float *x_local;
  int n_local;
  
  piStack_78 = GLOBAL_PERM_R;
  R._7_1_ = 0x4e;
  C = GLOBAL_R;
  options = (superlu_options_t *)GLOBAL_C;
  mem_usage = (mem_usage_t *)GLOBAL_OPTIONS;
  _rpg = GLOBAL_MEM_USAGE;
  spsolve::XX.nrow = n;
  spsolve::YY.nrow = n;
  spsolve::X.lda = n;
  spsolve::X.nzval = x;
  spsolve::Y.lda = n;
  spsolve::Y.nzval = y;
  sgsisx(GLOBAL_OPTIONS,GLOBAL_A,GLOBAL_PERM_C,GLOBAL_PERM_R,(int *)0x0,(char *)((long)&R + 7),
         GLOBAL_R,GLOBAL_C,GLOBAL_L,GLOBAL_U,(void *)0x0,0,&spsolve::YY,&spsolve::XX,&local_a8,
         &local_ac,(GlobalLU_t *)0x0,GLOBAL_MEM_USAGE,GLOBAL_STAT,(int_t *)&rcond);
  return;
}

Assistant:

void spsolve(int n, float x[], float y[])
{
    SuperMatrix *A = GLOBAL_A, *L = GLOBAL_L, *U = GLOBAL_U;
    SuperLUStat_t *stat = GLOBAL_STAT;
    int *perm_c = GLOBAL_PERM_C, *perm_r = GLOBAL_PERM_R;
    char equed[1] = {'N'};
    float *R = GLOBAL_R, *C = GLOBAL_C;
    superlu_options_t *options = GLOBAL_OPTIONS;
    mem_usage_t  *mem_usage = GLOBAL_MEM_USAGE;
    int_t info;
    static DNformat X, Y;
    static SuperMatrix XX = {SLU_DN, SLU_S, SLU_GE, 1, 1, &X};
    static SuperMatrix YY = {SLU_DN, SLU_S, SLU_GE, 1, 1, &Y};
    float rpg, rcond;

    XX.nrow = YY.nrow = n;
    X.lda = Y.lda = n;
    X.nzval = x;
    Y.nzval = y;

#if 0
    dcopy_(&n, y, &i_1, x, &i_1);
    sgstrs(NOTRANS, L, U, perm_c, perm_r, &XX, stat, &info);
#else
    sgsisx(options, A, perm_c, perm_r, NULL, equed, R, C,
	   L, U, NULL, 0, &YY, &XX, &rpg, &rcond, NULL,
	   mem_usage, stat, &info);
#endif
}